

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.h
# Opt level: O1

pair<int,_int> __thiscall asn1::MemBuffer::readDERHead(MemBuffer *this)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  
  puVar3 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = this->readpos;
  bVar1 = puVar3[uVar4];
  this->readpos = uVar4 + 1;
  bVar2 = puVar3[uVar4 + 1];
  this->readpos = uVar4 + 2;
  uVar5 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    uVar6 = uVar5 & 0x7f;
    if ((bVar2 & 0x7f) == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      uVar4 = this->readpos;
      do {
        uVar5 = uVar5 << 8 | (uint)puVar3[uVar4];
        this->readpos = uVar4 + 1;
        uVar6 = uVar6 - 1;
        uVar4 = uVar4 + 1;
      } while (uVar6 != 0);
    }
  }
  return (pair<int,_int>)((ulong)uVar5 << 0x20 | (ulong)bVar1);
}

Assistant:

std::pair<int, int> readDERHead()
    {
        int id = read<uint8_t>();
        int len = read<uint8_t>();
        if (len & 0x80) {
            int l = len & 0x7f;
            len = 0;
            while (l--) {
                len <<= 8;
                len |= read<uint8_t>();
            }
        }
        return std::make_pair(id, len);
    }